

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# display.c
# Opt level: O3

size_t input_nums(int *array,size_t length)

{
  int iVar1;
  void *__s;
  size_t sVar2;
  ulong uVar3;
  char *pcVar4;
  ulong uVar5;
  int guess;
  char input [1024];
  int local_454;
  size_t local_450;
  size_t local_448;
  int *local_440;
  char local_438 [1032];
  
  local_440 = array;
  __s = malloc(length);
  if (length == 0) {
    local_450 = 0;
  }
  else {
    memset(__s,0,length);
    sVar2 = 1;
    local_450 = 0;
    do {
      local_454 = -1;
      local_448 = sVar2;
      iVar1 = rand();
      uVar3 = (ulong)iVar1;
      do {
        uVar5 = uVar3 % length;
        uVar3 = uVar5 + 1;
      } while (*(char *)((long)__s + uVar5) != '\0');
      *(undefined1 *)((long)__s + uVar5) = 1;
      printf("Please input the \x1b[93m%zuth\x1b[0m number:\n",uVar3);
      while( true ) {
        printf("\x1b[96m> \x1b[0m");
        pcVar4 = fgets(local_438,0x400,_stdin);
        if (pcVar4 == (char *)0x0) goto LAB_00101552;
        if (local_438[0] == '\n') break;
        iVar1 = __isoc99_sscanf(local_438,"%d",&local_454);
        if (iVar1 != 0) goto LAB_00101503;
        printf("\x1b[91mInvalid number!\n\x1b[0m");
      }
      printf("\x1b[91mYou did not put a number!\n\x1b[0m");
LAB_00101503:
      if (local_454 == local_440[uVar5]) {
        printf("\x1b[92mGood job!\n\x1b[0m");
        local_450 = local_450 + 1;
      }
      else {
        printf("\x1b[91mWrong number!\n\x1b[0m");
      }
      sVar2 = local_448 + 1;
    } while (local_448 != length);
  }
LAB_00101552:
  free(__s);
  return local_450;
}

Assistant:

size_t input_nums(const int* array, const size_t length) {
  bool* guesses_done = (bool*)malloc(sizeof(bool) * length);
  for (size_t n = 0; n < length; n++) guesses_done[n] = false;
  size_t n_guesses = 0;
  size_t guesses_correct = 0;

  while (n_guesses++ < length) {
    char input[1024];
    int guess = -1;
    size_t guess_id = (size_t)rand() % length;

    // Step until we hit a false
    while (guesses_done[guess_id]) guess_id = (guess_id + 1) % length;
    guesses_done[guess_id] = true;

    printf("Please input the " ANSI_COLOR_YELLOW "%zuth" ANSI_COLOR_NONE " number:\n", guess_id + 1);

    while (true) {
      printf(ANSI_COLOR_CYAN "> " ANSI_COLOR_NONE);

      // EOF
      if (!fgets(input, 1024, stdin)) {
        free(guesses_done);
        return guesses_correct;
      }

      // Empty line: display a warning
      if (input[0] == '\n') {
        printf(ANSI_COLOR_RED "You did not put a number!\n" ANSI_COLOR_NONE);
        break;
      }

      if (!sscanf(input, "%d", &guess)) {
        printf(ANSI_COLOR_RED "Invalid number!\n" ANSI_COLOR_NONE);
        // loop again
      } else {
        break;
      }
    }

    if (guess == array[guess_id]) {
      printf(ANSI_COLOR_GREEN "Good job!\n" ANSI_COLOR_NONE);
      guesses_correct++;
    } else {
      printf(ANSI_COLOR_RED "Wrong number!\n" ANSI_COLOR_NONE);
    }
  }

  free(guesses_done);
  return guesses_correct;
}